

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgst07.c
# Opt level: O0

int cgst07(trans_t trans,int n,int nrhs,SuperMatrix *A,singlecomplex *b,int ldb,singlecomplex *x,
          int ldx,singlecomplex *xact,int ldxact,float *ferr,float *berr,float *reslts)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  int *addr;
  bool bVar5;
  float fVar6;
  float fVar7;
  float local_1c0;
  float local_1bc;
  int local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  char local_198 [8];
  char msg [256];
  NCformat *Astore;
  singlecomplex *Aval;
  float *rwork;
  float tmp;
  float eps;
  int notran;
  float errbnd;
  float xnorm;
  float ovfl;
  float unfl;
  int k;
  int j;
  int i;
  int n__1;
  int irow;
  int imax;
  float axbi;
  float diff;
  float d__4;
  float d__3;
  float d__2;
  float d__1;
  int c__1;
  int ldb_local;
  singlecomplex *b_local;
  SuperMatrix *A_local;
  int nrhs_local;
  int n_local;
  trans_t trans_local;
  
  d__2 = 1.4013e-45;
  if ((n < 1) || (nrhs < 1)) {
    *reslts = 0.0;
    reslts[1] = 0.0;
  }
  else {
    d__1 = (float)ldb;
    _c__1 = b;
    b_local = (singlecomplex *)A;
    A_local._0_4_ = nrhs;
    A_local._4_4_ = n;
    nrhs_local = trans;
    fVar6 = smach("Epsilon");
    fVar7 = smach("Safe minimum");
    bVar5 = nrhs_local == 0;
    addr = (int *)superlu_malloc((long)A_local._4_4_ << 2);
    if (addr == (int *)0x0) {
      sprintf(local_198,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0x71,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cgst07.c"
             );
      superlu_abort_and_exit(local_198);
    }
    msg._248_8_ = b_local[3];
    lVar4 = *(long *)(msg._248_8_ + 8);
    eps = 0.0;
    for (unfl = 0.0; (int)unfl < (int)A_local; unfl = (float)((int)unfl + 1)) {
      j = A_local._4_4_;
      n__1 = icamax_(&j,x + (int)unfl * ldx,(integer *)&d__2);
      d__4 = x[n__1 + -1 + (int)unfl * ldx].r;
      diff = x[n__1 + -1 + (int)unfl * ldx].i;
      d__3 = ABS(d__4) + ABS(diff);
      local_19c = fVar7;
      if (fVar7 < d__3) {
        local_19c = d__3;
      }
      imax = 0;
      for (k = 0; k < A_local._4_4_; k = k + 1) {
        d__4 = x[k + (int)unfl * ldx].r - xact[k + (int)unfl * ldxact].r;
        diff = x[k + (int)unfl * ldx].i - xact[k + (int)unfl * ldxact].i;
        d__3 = ABS(d__4) + ABS(diff);
        local_1a0 = d__3;
        if (d__3 < (float)imax) {
          local_1a0 = (float)imax;
        }
        imax = (int)local_1a0;
      }
      if ((1.0 < local_19c) || ((float)imax <= (1.0 / fVar7) * local_19c)) {
        d__3 = ((float)imax / local_19c) / ferr[(int)unfl];
        local_1a4 = d__3;
        if (d__3 < eps) {
          local_1a4 = eps;
        }
        eps = local_1a4;
      }
      else {
        eps = 1.0 / fVar6;
      }
    }
    *reslts = eps;
    for (ovfl = 0.0; (int)ovfl < (int)A_local; ovfl = (float)((int)ovfl + 1)) {
      for (k = 0; k < A_local._4_4_; k = k + 1) {
        addr[k] = (int)(float)(ABS((double)_c__1[k + (int)ovfl * (int)d__1].r) +
                              (double)((ulong)(double)_c__1[k + (int)ovfl * (int)d__1].i &
                                      (ulong)DAT_0013a380));
      }
      if (bVar5) {
        for (unfl = 0.0; (int)unfl < A_local._4_4_; unfl = (float)((int)unfl + 1)) {
          fVar1 = x[(int)unfl + (int)ovfl * ldx].r;
          fVar2 = x[(int)unfl + (int)ovfl * ldx].i;
          for (k = *(int *)(*(long *)(msg._248_8_ + 0x18) + (long)(int)unfl * 4);
              k < *(int *)(*(long *)(msg._248_8_ + 0x18) + (long)((int)unfl + 1) * 4); k = k + 1) {
            diff = *(float *)(lVar4 + 4 + (long)k * 8);
            iVar3 = *(int *)(*(long *)(msg._248_8_ + 0x10) + (long)k * 4);
            addr[iVar3] = (int)((ABS(*(float *)(lVar4 + (long)k * 8)) + ABS(diff)) *
                                (ABS(fVar1) + ABS(fVar2)) + (float)addr[iVar3]);
          }
        }
      }
      else {
        for (unfl = 0.0; (int)unfl < A_local._4_4_; unfl = (float)((int)unfl + 1)) {
          rwork._4_4_ = 0.0;
          for (k = *(int *)(*(long *)(msg._248_8_ + 0x18) + (long)(int)unfl * 4);
              k < *(int *)(*(long *)(msg._248_8_ + 0x18) + (long)((int)unfl + 1) * 4); k = k + 1) {
            i = *(int *)(*(long *)(msg._248_8_ + 0x10) + (long)k * 4);
            diff = *(float *)(lVar4 + (long)k * 8);
            axbi = *(float *)(lVar4 + 4 + (long)k * 8);
            rwork._4_4_ = (ABS(diff) + ABS(axbi)) *
                          (ABS(x[i + (int)ovfl * ldx].r) + ABS(x[i + (int)ovfl * ldx].i)) +
                          rwork._4_4_;
          }
          addr[(int)unfl] = (int)(rwork._4_4_ + (float)addr[(int)unfl]);
        }
      }
      irow = *addr;
      for (k = 1; k < A_local._4_4_; k = k + 1) {
        if ((float)addr[k] <= (float)irow) {
          local_1a8 = addr[k];
        }
        else {
          local_1a8 = irow;
        }
        irow = local_1a8;
      }
      d__3 = (float)irow;
      d__4 = (float)(A_local._4_4_ + 1) * fVar7;
      local_1bc = d__4;
      if (d__4 < (float)irow) {
        local_1bc = (float)irow;
      }
      local_1c0 = berr[(int)ovfl] /
                  ((float)(A_local._4_4_ + 1) * fVar6 +
                  ((float)(A_local._4_4_ + 1) * fVar7) / local_1bc);
      if (ovfl == 0.0) {
        reslts[1] = local_1c0;
      }
      else {
        if (local_1c0 < reslts[1]) {
          local_1c0 = reslts[1];
        }
        reslts[1] = local_1c0;
      }
    }
    superlu_free(addr);
  }
  return 0;
}

Assistant:

int cgst07(trans_t trans, int n, int nrhs, SuperMatrix *A, singlecomplex *b,
           int ldb, singlecomplex *x, int ldx, singlecomplex *xact,
           int ldxact, float *ferr, float *berr, float *reslts)
{
    /* Table of constant values */
    int c__1 = 1;

    /* System generated locals */
    float d__1, d__2;
    float d__3, d__4;

    /* Local variables */
    float diff, axbi;
    int    imax, irow, n__1;
    int    i, j, k;
    float unfl, ovfl;
    float xnorm;
    float errbnd;
    int    notran;
    float eps, tmp;
    float *rwork;
    singlecomplex *Aval;
    NCformat *Astore;

    /* Function prototypes */
    extern int    icamax_(int *, singlecomplex *, int *);


    /* Quick exit if N = 0 or NRHS = 0. */
    if ( n <= 0 || nrhs <= 0 ) {
	reslts[0] = 0.;
	reslts[1] = 0.;
	return 0;
    }

    eps = smach("Epsilon");
    unfl = smach("Safe minimum");
    ovfl   = 1. / unfl;
    notran = (trans == NOTRANS);

    rwork  = (float *) SUPERLU_MALLOC(n*sizeof(float));
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");
    Astore = A->Store;
    Aval   = (singlecomplex *) Astore->nzval;
    
    /* Test 1:  Compute the maximum of   
       norm(X - XACT) / ( norm(X) * FERR )   
       over all the vectors X and XACT using the infinity-norm. */

    errbnd = 0.;
    for (j = 0; j < nrhs; ++j) {
	n__1 = n;
	imax = icamax_(&n__1, &x[j*ldx], &c__1);
	d__1 = (d__2 = x[imax-1 + j*ldx].r, fabs(d__2)) + 
               (d__3 = x[imax-1 + j*ldx].i, fabs(d__3));
	xnorm = SUPERLU_MAX(d__1,unfl);
	diff = 0.;
	for (i = 0; i < n; ++i) {
	    d__1 = (d__2 = x[i+j*ldx].r - xact[i+j*ldxact].r, fabs(d__2)) +
                   (d__3 = x[i+j*ldx].i - xact[i+j*ldxact].i, fabs(d__3));
	    diff = SUPERLU_MAX(diff, d__1);
	}

	if (xnorm > 1.) {
	    goto L20;
	} else if (diff <= ovfl * xnorm) {
	    goto L20;
	} else {
	    errbnd = 1. / eps;
	    goto L30;
	}

L20:
#if 0	
	if (diff / xnorm <= ferr[j]) {
	    d__1 = diff / xnorm / ferr[j];
	    errbnd = SUPERLU_MAX(errbnd,d__1);
	} else {
	    errbnd = 1. / eps;
	}
#endif
	d__1 = diff / xnorm / ferr[j];
	errbnd = SUPERLU_MAX(errbnd,d__1);
	/*printf("Ferr: %f\n", errbnd);*/
L30:
	;
    }
    reslts[0] = errbnd;

    /* Test 2: Compute the maximum of BERR / ( (n+1)*EPS + (*) ), where 
       (*) = (n+1)*UNFL / (min_i (abs(op(A))*abs(X) + abs(b))_i ) */

    for (k = 0; k < nrhs; ++k) {
	for (i = 0; i < n; ++i) 
            rwork[i] = (d__1 = b[i + k*ldb].r, fabs(d__1)) +
                       (d__2 = b[i + k*ldb].i, fabs(d__2));
	if ( notran ) {
	    for (j = 0; j < n; ++j) {
		tmp = (d__1 = x[j + k*ldx].r, fabs(d__1)) +
                      (d__2 = x[j + k*ldx].i, fabs(d__2));
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    d__1 = (d__2 = Aval[i].r, fabs(d__2)) +
                           (d__3 = Aval[i].i, fabs(d__3));
		    rwork[Astore->rowind[i]] += d__1 * tmp;
                }
	    }
	} else {
	    for (j = 0; j < n; ++j) {
		tmp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    d__1 = (d__2 = x[irow + k*ldx].r, fabs(d__2)) +
                           (d__3 = x[irow + k*ldx].i, fabs(d__3));
                    d__2 = (d__3 = Aval[i].r, fabs(d__3)) +
                           (d__4 = Aval[i].i, fabs(d__4));
		    tmp += d__2 * d__1;
		}
		rwork[j] += tmp;
	    }
	}

	axbi = rwork[0];
	for (i = 1; i < n; ++i) axbi = SUPERLU_MIN(axbi, rwork[i]);
	
	/* Computing MAX */
	d__1 = axbi, d__2 = (n + 1) * unfl;
	tmp = berr[k] / ((n + 1) * eps + (n + 1) * unfl / SUPERLU_MAX(d__1,d__2));
	
	if (k == 0) {
	    reslts[1] = tmp;
	} else {
	    reslts[1] = SUPERLU_MAX(reslts[1],tmp);
	}
    }

    SUPERLU_FREE(rwork);
    return 0;

}